

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
fmt::v7::detail::
arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>::
operator()(arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
           *this,bool value)

{
  buffer_appender<char> bVar1;
  size_t in_RCX;
  void *in_RDX;
  byte in_SIL;
  arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
  *in_RDI;
  buffer_appender<char> in_stack_00000028;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_30;
  format_specs *in_stack_ffffffffffffffe0;
  
  if ((in_RDI->specs_ == (format_specs *)0x0) || (in_RDI->specs_->type == '\0')) {
    write(in_RDI,(uint)((in_SIL & 1) != 0),in_RDX,in_RCX);
    local_30.container =
         (in_RDI->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  }
  else {
    if (in_RDI->specs_ == (format_specs *)0x0) {
      bVar1 = write<char,_fmt::v7::detail::buffer_appender<char>,_int,_0>
                        (in_stack_00000028,this._4_4_);
      (in_RDI->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (buffer<char> *)
           bVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
    }
    else {
      write_int<int>(in_RDI,(uint)((in_SIL & 1) != 0),in_stack_ffffffffffffffe0);
    }
    local_30.container =
         (in_RDI->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  }
  return (iterator)(back_insert_iterator<fmt::v7::detail::buffer<char>_>)local_30.container;
}

Assistant:

iterator operator()(bool value) {
    if (specs_ && specs_->type) return (*this)(value ? 1 : 0);
    write(value != 0);
    return out_;
  }